

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O0

void __thiscall DIS::RecordSet::RecordSet(RecordSet *this)

{
  RecordSet *this_local;
  
  this->_vptr_RecordSet = (_func_int **)&PTR__RecordSet_00272d20;
  this->_recordID = 0;
  this->_recordSetSerialNumber = 0;
  this->_recordLength = 0;
  this->_recordCount = 0;
  this->_recordValues = 0;
  this->_pad4 = '\0';
  return;
}

Assistant:

RecordSet::RecordSet():
   _recordID(0), 
   _recordSetSerialNumber(0), 
   _recordLength(0), 
   _recordCount(0), 
   _recordValues(0), 
   _pad4(0)
{
}